

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall
wallet::wallet_tests::wallet_sync_tx_invalid_state_test::test_method
          (wallet_sync_tx_invalid_state_test *this)

{
  bool bVar1;
  CWallet *this_00;
  MockableDatabase *pMVar2;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  runtime_error *ex;
  CWalletTx *wtx_to_spend_1;
  CWalletTx *new_wtx;
  CWalletTx *wtx_to_spend;
  Txid *tx_id_to_spend;
  CMutableTransaction mtx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock73;
  Txid good_tx_id;
  T op_dest;
  CWallet wallet;
  char *in_stack_fffffffffffff418;
  CMutableTransaction *in_stack_fffffffffffff420;
  char *in_stack_fffffffffffff428;
  CWallet *in_stack_fffffffffffff430;
  undefined4 in_stack_fffffffffffff438;
  int in_stack_fffffffffffff43c;
  undefined6 in_stack_fffffffffffff440;
  undefined1 in_stack_fffffffffffff446;
  undefined1 in_stack_fffffffffffff447;
  undefined4 in_stack_fffffffffffff448;
  int in_stack_fffffffffffff44c;
  const_string *in_stack_fffffffffffff450;
  allocator<char> *in_stack_fffffffffffff458;
  CWallet *in_stack_fffffffffffff460;
  undefined7 in_stack_fffffffffffff468;
  undefined1 in_stack_fffffffffffff46f;
  isminefilter *in_stack_fffffffffffff478;
  CWalletTx *in_stack_fffffffffffff480;
  CWallet *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49f;
  CWallet *in_stack_fffffffffffff4a0;
  undefined8 in_stack_fffffffffffff4b0;
  OutputType type;
  CTransactionRef *in_stack_fffffffffffff4e0;
  CTransactionRef *tx;
  CWallet *in_stack_fffffffffffff4e8;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
  *in_stack_fffffffffffff528;
  string *in_stack_fffffffffffff530;
  Chain *in_stack_fffffffffffff538;
  CWallet *in_stack_fffffffffffff540;
  undefined1 in_stack_fffffffffffff626;
  undefined1 in_stack_fffffffffffff627;
  UpdateWalletTxFn *in_stack_fffffffffffff628;
  TxState *in_stack_fffffffffffff630;
  CTransactionRef *in_stack_fffffffffffff638;
  CWallet *in_stack_fffffffffffff640;
  const_string local_970;
  lazy_ostream local_960 [2];
  assertion_result local_940 [4];
  undefined4 local_8d4;
  CMutableTransaction local_8d0;
  CMutableTransaction local_868 [2];
  undefined4 local_7ec;
  CMutableTransaction local_7e8 [2];
  undefined4 local_744;
  allocator<char> local_701 [16];
  allocator<char> local_6f1 [489];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  long local_8;
  
  type = (OutputType)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
             (char *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_508 = 0;
  uStack_500 = 0;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffff418);
  CreateMockableWalletDatabase((MockableData *)in_stack_fffffffffffff428);
  CWallet::CWallet(in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530,
                   in_stack_fffffffffffff528);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffff428);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffff418);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff418);
  std::allocator<char>::~allocator(local_6f1);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff418);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff458,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff450,
             (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
             (char *)CONCAT17(in_stack_fffffffffffff447,
                              CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)),
             in_stack_fffffffffffff43c,SUB41((uint)in_stack_fffffffffffff438 >> 0x18,0));
  CWallet::SetWalletFlag(in_stack_fffffffffffff460,(uint64_t)in_stack_fffffffffffff458);
  CWallet::SetupDescriptorScriptPubKeyMans(in_RDI);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
             (char *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  CWallet::GetNewDestination
            (in_stack_fffffffffffff4a0,type,
             (string *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450,
             in_stack_fffffffffffff44c,
             (char *)CONCAT17(in_stack_fffffffffffff447,
                              CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)),
             (char *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)in_stack_fffffffffffff418);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff418,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xe3dceb);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_fffffffffffff418);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff418);
  std::allocator<char>::~allocator(local_701);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff418);
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff418);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
             (long *)in_stack_fffffffffffff430,(CScript *)in_stack_fffffffffffff428);
  CScript::~CScript((CScript *)in_stack_fffffffffffff418);
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)
             CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffff418);
  local_744 = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>,int>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
             (transaction_identifier<false> *)in_stack_fffffffffffff430,
             (int *)in_stack_fffffffffffff428);
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffff420);
  std::
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  ::variant<wallet::TxStateInMempool,void,void,wallet::TxStateInMempool,void>
            ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)in_stack_fffffffffffff428,(TxStateInMempool *)in_stack_fffffffffffff420);
  std::function<bool_(wallet::CWalletTx_&,_bool)>::function
            ((function<bool_(wallet::CWalletTx_&,_bool)> *)in_stack_fffffffffffff428,
             in_stack_fffffffffffff420);
  CWallet::AddToWallet
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
             in_stack_fffffffffffff628,(bool)in_stack_fffffffffffff627,
             (bool)in_stack_fffffffffffff626);
  CWalletTx::GetHash((CWalletTx *)in_stack_fffffffffffff418);
  std::function<bool_(wallet::CWalletTx_&,_bool)>::~function
            ((function<bool_(wallet::CWalletTx_&,_bool)> *)in_stack_fffffffffffff418);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff418);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff418);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff458,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff450,
             (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
             (char *)CONCAT17(in_stack_fffffffffffff447,
                              CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)),
             in_stack_fffffffffffff43c,SUB41((uint)in_stack_fffffffffffff438 >> 0x18,0));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_fffffffffffff418);
  CWallet::GetWalletTx(in_stack_fffffffffffff430,(uint256 *)in_stack_fffffffffffff428);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
               CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff447,
                        CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff420,(char (*) [1])in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    local_7e8[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 2;
    local_7e8[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CachedTxGetAvailableCredit
                            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
                             in_stack_fffffffffffff478);
    local_7e8[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5f5e100;
    in_stack_fffffffffffff428 = "1 * COIN";
    in_stack_fffffffffffff420 = local_7e8;
    in_stack_fffffffffffff418 = "CachedTxGetAvailableCredit(wallet, *wtx_to_spend)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_7e8[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_7e8[0].vout,0x3dd,1,2,
               &local_7e8[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff418);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff418);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff418);
  local_7ec = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>const&,int>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
             (transaction_identifier<false> *)in_stack_fffffffffffff430,
             (int *)in_stack_fffffffffffff428);
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffff420);
  CWallet::transactionAddedToMempool(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff418);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff418);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff458,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff450,
             (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
             (char *)CONCAT17(in_stack_fffffffffffff447,
                              CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)),
             in_stack_fffffffffffff43c,SUB41((uint)in_stack_fffffffffffff438 >> 0x18,0));
  transaction_identifier<false>::ToUint256
            ((transaction_identifier<false> *)in_stack_fffffffffffff418);
  this_00 = (CWallet *)
            CWallet::GetWalletTx(in_stack_fffffffffffff430,(uint256 *)in_stack_fffffffffffff428);
  do {
    tx = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
               CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff447,
                        CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff420,(char (*) [1])in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    local_868[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 2;
    local_868[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CachedTxGetAvailableCredit
                            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
                             in_stack_fffffffffffff478);
    local_868[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5f5e100;
    in_stack_fffffffffffff428 = "1 * COIN";
    in_stack_fffffffffffff420 = local_868;
    in_stack_fffffffffffff418 = "CachedTxGetAvailableCredit(wallet, *new_wtx)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_868[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_868[0].vout,0x3ed,1,2,
               &local_868[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff418);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_fffffffffffff418);
  CWallet::GetWalletTx(in_stack_fffffffffffff430,(uint256 *)in_stack_fffffffffffff428);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
               CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff447,
                        CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff420,(char (*) [1])in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = 2;
    local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CachedTxGetAvailableCredit
                            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
                             in_stack_fffffffffffff478);
    local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    in_stack_fffffffffffff428 = "0 * COIN";
    in_stack_fffffffffffff420 = &local_8d0;
    in_stack_fffffffffffff418 = "CachedTxGetAvailableCredit(wallet, *wtx_to_spend)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_8d0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_8d0.vout,0x3f1,1,2,
               &local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff418);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff418);
  pMVar2 = GetMockableDatabase((CWallet *)in_stack_fffffffffffff418);
  pMVar2->m_pass = false;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff418);
  local_8d4 = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<transaction_identifier<false>const&,int>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
             (transaction_identifier<false> *)in_stack_fffffffffffff430,
             (int *)in_stack_fffffffffffff428);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
               (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
               CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
               (const_string *)
               CONCAT17(in_stack_fffffffffffff447,
                        CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)));
    MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffff420);
    CWallet::transactionAddedToMempool(this_00,tx);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff418);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff458,in_stack_fffffffffffff450,
                 CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
                 (const_string *)
                 CONCAT17(in_stack_fffffffffffff447,
                          CONCAT16(in_stack_fffffffffffff446,in_stack_fffffffffffff440)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff428,
                 SUB81((ulong)in_stack_fffffffffffff420 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff420,(char (*) [53])in_stack_fffffffffffff418)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)in_stack_fffffffffffff420,(unsigned_long)in_stack_fffffffffffff418);
      in_stack_fffffffffffff418 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_940,local_960,&local_970,0x3fd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_fffffffffffff418);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff418);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    in_stack_fffffffffffff446 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff446);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff418);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff418);
  CWallet::~CWallet((CWallet *)in_stack_fffffffffffff428);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_sync_tx_invalid_state_test, TestingSetup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
    {
        LOCK(wallet.cs_wallet);
        wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        wallet.SetupDescriptorScriptPubKeyMans();
    }

    // Add tx to wallet
    const auto op_dest{*Assert(wallet.GetNewDestination(OutputType::BECH32M, ""))};

    CMutableTransaction mtx;
    mtx.vout.emplace_back(COIN, GetScriptForDestination(op_dest));
    mtx.vin.emplace_back(Txid::FromUint256(m_rng.rand256()), 0);
    const auto& tx_id_to_spend = wallet.AddToWallet(MakeTransactionRef(mtx), TxStateInMempool{})->GetHash();

    {
        // Cache and verify available balance for the wtx
        LOCK(wallet.cs_wallet);
        const CWalletTx* wtx_to_spend = wallet.GetWalletTx(tx_id_to_spend);
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *wtx_to_spend), 1 * COIN);
    }

    // Now the good case:
    // 1) Add a transaction that spends the previously created transaction
    // 2) Verify that the available balance of this new tx and the old one is updated (prev tx is marked dirty)

    mtx.vin.clear();
    mtx.vin.emplace_back(tx_id_to_spend, 0);
    wallet.transactionAddedToMempool(MakeTransactionRef(mtx));
    const auto good_tx_id{mtx.GetHash()};

    {
        // Verify balance update for the new tx and the old one
        LOCK(wallet.cs_wallet);
        const CWalletTx* new_wtx = wallet.GetWalletTx(good_tx_id.ToUint256());
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *new_wtx), 1 * COIN);

        // Now the old wtx
        const CWalletTx* wtx_to_spend = wallet.GetWalletTx(tx_id_to_spend);
        BOOST_CHECK_EQUAL(CachedTxGetAvailableCredit(wallet, *wtx_to_spend), 0 * COIN);
    }

    // Now the bad case:
    // 1) Make db always fail
    // 2) Try to add a transaction that spends the previously created transaction and
    //    verify that we are not moving forward if the wallet cannot store it
    GetMockableDatabase(wallet).m_pass = false;
    mtx.vin.clear();
    mtx.vin.emplace_back(good_tx_id, 0);
    BOOST_CHECK_EXCEPTION(wallet.transactionAddedToMempool(MakeTransactionRef(mtx)),
                          std::runtime_error,
                          HasReason("DB error adding transaction to wallet, write failed"));
}